

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptType *type)

{
  int64_t base_value;
  ScriptType *type_local;
  ScriptElement *this_local;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_003eb820;
  this->type_ = kElementOpCode;
  ScriptOperator::ScriptOperator(&this->op_code_,*type);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = 0;
  if ((*type == kOp1Negate) || ((0x50 < (int)*type && ((int)*type < 0x61)))) {
    this->value_ = (ulong)*type - 0x50;
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptType& type)
    : type_(kElementOpCode), op_code_(type), binary_data_(), value_(0) {
  if ((type == kOp1Negate) || ((type >= kOp_1) && (type <= kOp_16))) {
    // convert to numeric format
    int64_t base_value = static_cast<int64_t>(kOp_1) - 1;
    value_ = static_cast<int64_t>(type) - base_value;
  }
}